

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O1

int map(thread_pool_t *pool,future_t *future,future_t *from,
       _func_void_ptr_void_ptr_size_t_size_t_ptr *function)

{
  int iVar1;
  undefined8 *puVar2;
  runnable_t *prVar3;
  
  iVar1 = future_init(future);
  if (iVar1 == -1) {
    map_cold_4();
  }
  else {
    puVar2 = (undefined8 *)malloc(0x20);
    if (puVar2 == (undefined8 *)0x0) {
      map_cold_3();
    }
    else {
      puVar2[1] = function;
      *puVar2 = from;
      puVar2[2] = future;
      puVar2[3] = 0;
      prVar3 = (runnable_t *)malloc(0x18);
      if (prVar3 == (runnable_t *)0x0) {
        map_cold_2();
      }
      else {
        prVar3->function = map_runnable;
        prVar3->arg = puVar2;
        prVar3->argsz = 0x20;
        puVar2[3] = prVar3;
        iVar1 = defer(pool,*prVar3);
        if (iVar1 == 0) {
          return 0;
        }
        map_cold_1();
      }
    }
  }
  return -1;
}

Assistant:

int map(thread_pool_t *pool, future_t *future, future_t *from,
        void *(*function)(void *, size_t, size_t *)) {

    if (future_init(future) == -1) {
        err("map(): future_init() failed as future is NULL.\n");
        return -1;
    }

    map_wrap_t *wrapper = malloc(sizeof(map_wrap_t));
    if (wrapper == NULL) {
        err("map(): malloc failed for creating map_wrapper.\n");
        return -1;
    }

    wrapper->func = function;
    wrapper->future_from = from;
    wrapper->new_future = future;
    wrapper->runnable = NULL;

    runnable_t *my_runnable = malloc(sizeof(runnable_t));
    if (my_runnable == NULL) {
        err("map(): malloc failed for creating runnable.\n");
        return -1;
    }

    my_runnable->function = map_runnable;
    my_runnable->arg = wrapper;
    my_runnable->argsz = sizeof(map_wrap_t);

    wrapper->runnable = my_runnable;

    if (defer(pool, *my_runnable) != 0) {
        err("map(): Submitting new task failed.\n");
        free(wrapper);
        free(my_runnable);
        return -1;
    }

    return 0;
}